

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O0

uint32_t __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::setup
          (cache<uint256,_SignatureCacheHasher> *this,uint32_t new_size)

{
  long lVar1;
  uint *puVar2;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  uint *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  vector<bool,_std::allocator<bool>_> *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  puVar2 = std::max<unsigned_int>((uint *)in_RDI,in_stack_ffffffffffffffc8);
  (in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = *puVar2;
  dVar3 = std::log2((double)CONCAT44(extraout_XMM0_Db,
                                     (float)(in_RDI->super__Bvector_base<std::allocator<bool>_>).
                                            _M_impl.super__Bvector_impl_data._M_finish.
                                            super__Bit_iterator_base._M_offset));
  *(char *)&in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = (char)(int)SUB84(dVar3,0);
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(size_type)this_00);
  bit_packed_atomic_flags::setup((bit_packed_atomic_flags *)this_00,in_stack_ffffffffffffffdc);
  std::vector<bool,_std::allocator<bool>_>::resize
            (this_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),this._7_1_);
  puVar2 = std::max<unsigned_int>((uint *)in_RDI,in_stack_ffffffffffffffc8);
  *(uint *)((long)&((_Head_base<0UL,_std::atomic<unsigned_char>_*,_false> *)
                   &in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_M_head_impl +
           4) = *puVar2;
  *(uint *)&((_Head_base<0UL,_std::atomic<unsigned_char>_*,_false> *)
            &in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p)->_M_head_impl =
       *(uint *)((long)&((_Head_base<0UL,_std::atomic<unsigned_char>_*,_false> *)
                        &in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->
                        _M_head_impl + 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t setup(uint32_t new_size)
    {
        // depth_limit must be at least one otherwise errors can occur.
        size = std::max<uint32_t>(2, new_size);
        depth_limit = static_cast<uint8_t>(std::log2(static_cast<float>(size)));
        table.resize(size);
        collection_flags.setup(size);
        epoch_flags.resize(size);
        // Set to 45% as described above
        epoch_size = std::max(uint32_t{1}, (45 * size) / 100);
        // Initially set to wait for a whole epoch
        epoch_heuristic_counter = epoch_size;
        return size;
    }